

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryBuilder::readTags(WasmBinaryBuilder *this)

{
  Module *this_00;
  IString *this_01;
  WasmBinaryBuilder *this_02;
  char cVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t index;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  char cVar8;
  ulong __val;
  string_view sVar9;
  Signature SVar10;
  size_type *local_80;
  string __str;
  long local_50;
  long lStack_48;
  WasmBinaryBuilder *local_40;
  _Head_base<0UL,_wasm::Tag_*,_false> local_38;
  __single_object tag;
  
  local_40 = this;
  bVar2 = isDebugEnabled("binary");
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"== readTags\n",0xc);
  }
  uVar3 = getU32LEB(local_40);
  bVar2 = isDebugEnabled("binary");
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"num: ",5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if ((ulong)uVar3 != 0) {
    __val = 0;
    do {
      bVar2 = isDebugEnabled("binary");
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"read one\n",9);
      }
      this_02 = local_40;
      getInt8(local_40);
      index = getU32LEB(this_02);
      this_00 = this_02->wasm;
      cVar8 = '\x01';
      if (9 < __val) {
        uVar6 = __val;
        cVar1 = '\x04';
        do {
          cVar8 = cVar1;
          if (uVar6 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_00965474;
          }
          if (uVar6 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_00965474;
          }
          if (uVar6 < 10000) goto LAB_00965474;
          bVar2 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          cVar1 = cVar8 + '\x04';
        } while (bVar2);
        cVar8 = cVar8 + '\x01';
      }
LAB_00965474:
      local_80 = &__str._M_string_length;
      std::__cxx11::string::_M_construct((ulong)&local_80,cVar8);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_80,(uint)__str._M_dataplus._M_p,__val);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0xba52c8);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_50 = *plVar7;
        lStack_48 = plVar5[3];
        __str.field_2._8_8_ = &local_50;
      }
      else {
        local_50 = *plVar7;
        __str.field_2._8_8_ = (long *)*plVar5;
      }
      this_01 = (IString *)plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      sVar9._M_str = (char *)0x0;
      sVar9._M_len = __str.field_2._8_8_;
      sVar9 = IString::interned(this_01,sVar9,SUB81(plVar7,0));
      SVar10 = getSignatureByTypeIndex(local_40,index);
      local_38._M_head_impl = (Tag *)operator_new(0x48);
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
      *(undefined8 *)&((local_38._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
      ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
      ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
      ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar9;
      (local_38._M_head_impl)->sig = SVar10;
      Module::addTag(this_00,(unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)&local_38);
      if (local_38._M_head_impl != (Tag *)0x0) {
        operator_delete(local_38._M_head_impl,0x48);
      }
      local_38._M_head_impl = (Tag *)0x0;
      if ((long *)__str.field_2._8_8_ != &local_50) {
        operator_delete((void *)__str.field_2._8_8_,local_50 + 1);
      }
      if (local_80 != &__str._M_string_length) {
        operator_delete(local_80,__str._M_string_length + 1);
      }
      __val = __val + 1;
    } while (__val != uVar3);
  }
  return;
}

Assistant:

void WasmBinaryBuilder::readTags() {
  BYN_TRACE("== readTags\n");
  size_t numTags = getU32LEB();
  BYN_TRACE("num: " << numTags << std::endl);
  for (size_t i = 0; i < numTags; i++) {
    BYN_TRACE("read one\n");
    getInt8(); // Reserved 'attribute' field
    auto typeIndex = getU32LEB();
    wasm.addTag(Builder::makeTag("tag$" + std::to_string(i),
                                 getSignatureByTypeIndex(typeIndex)));
  }
}